

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  pointer __s;
  int *piVar8;
  void *__addr;
  size_type *psVar9;
  __sighandler_t p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong *puVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  undefined8 uVar16;
  ulong uVar17;
  size_t __len;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction saved_sigprof_action;
  string filter_flag;
  sigaction ignore_sigprof_action;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c8 [2];
  string local_1c0;
  value_type local_1a0;
  _union_1457 local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  value_type local_e8;
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  ulong local_b8;
  ulong uStack_b0;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_1f0);
  if (iVar4 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar9) {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
      local_2b0.field_2._8_8_ = plVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
      local_2d0.field_2._8_8_ = plVar6[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x555;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_c8.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_b8 = *(ulong *)p_Var10;
      uStack_b0 = plVar6[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var10;
    }
    local_c0 = (undefined1  [8])plVar6[1];
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_180.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar14) {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_170[0]._8_8_ = plVar6[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_180);
  }
  iVar4 = fcntl(local_1ec,2,0);
  if (iVar4 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar9) {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
      local_2b0.field_2._8_8_ = plVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
      local_2d0.field_2._8_8_ = plVar6[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x558;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_c8.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_b8 = *(ulong *)p_Var10;
      uStack_b0 = plVar6[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var10;
    }
    local_c0 = (undefined1  [8])plVar6[1];
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_180.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar14) {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_170[0]._8_8_ = plVar6[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_180);
  }
  paVar14 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  paVar2 = &local_2d0.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
    local_2d0.field_2._8_8_ = plVar6[3];
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2f0.field_2._M_allocated_capacity = *psVar9;
    local_2f0.field_2._8_8_ = plVar6[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *psVar9;
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if ((__sighandler_t)*plVar6 == p_Var10) {
    local_b8 = *(ulong *)p_Var10;
    uStack_b0 = plVar6[3];
    local_c8.sa_handler = (__sighandler_t)&local_b8;
  }
  else {
    local_b8 = *(ulong *)p_Var10;
    local_c8.sa_handler = (__sighandler_t)*plVar6;
  }
  local_c0 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180.sa_handler = (__sighandler_t)local_170;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar11) {
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_170[0]._8_8_ = plVar6[3];
  }
  else {
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_180.sa_handler = (__sighandler_t)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)paVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e8.field_2._M_allocated_capacity = *psVar9;
    local_e8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar9;
    local_e8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_e8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar14) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_250.field_2._M_allocated_capacity = *psVar9;
    local_250.field_2._8_8_ = plVar6[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar9;
    local_250._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_250._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_290.field_2._M_allocated_capacity = *psVar9;
    local_290.field_2._8_8_ = plVar6[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar9;
    local_290._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_290._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_270.field_2._M_allocated_capacity = *psVar9;
    local_270.field_2._8_8_ = plVar6[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar9;
    local_270._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_270._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar12 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_2b0.field_2._M_allocated_capacity = *puVar12;
    local_2b0.field_2._8_8_ = plVar6[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *puVar12;
    local_2b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2b0._M_string_length = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_210,&this->line_);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar14) {
    uVar16 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_210._M_string_length + local_2b0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
        &local_210.field_2) {
      uVar16 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_210._M_string_length + local_2b0._M_string_length) goto LAB_001176bc;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_210,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_001176bc:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2b0,
                        (ulong)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                        local_210._M_dataplus._M_p._0_4_));
  }
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
    local_2d0.field_2._8_8_ = puVar7[3];
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
    local_2d0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_2d0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  puVar12 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_2f0.field_2._M_allocated_capacity = *puVar12;
    local_2f0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar12;
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2f0._M_string_length = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1e8,local_1c8);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    uVar16 = local_2f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < (pointer)(local_1e8._M_string_length + local_2f0._M_string_length)) {
    uVar16 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < (pointer)(local_1e8._M_string_length + local_2f0._M_string_length))
    goto LAB_001177df;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
  }
  else {
LAB_001177df:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_c8.sa_handler = (__sighandler_t)&local_b8;
  p_Var10 = (__sighandler_t)(puVar7 + 2);
  if ((__sighandler_t)*puVar7 == p_Var10) {
    local_b8 = *(ulong *)p_Var10;
    uStack_b0 = puVar7[3];
  }
  else {
    local_b8 = *(ulong *)p_Var10;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0 = (undefined1  [8])puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *p_Var10 = (__sighandler_t)0x0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180.sa_handler = (__sighandler_t)local_170;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar11) {
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_170[0]._8_8_ = plVar6[3];
  }
  else {
    local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_180.sa_handler = (__sighandler_t)*plVar6;
  }
  local_178 = plVar6[1];
  *plVar6 = (long)paVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1c0,&local_1ec);
  uVar17 = CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length) + local_178;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    uVar16 = local_170[0]._M_allocated_capacity;
  }
  if ((ulong)uVar16 < uVar17) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar16 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < uVar17) goto LAB_00117933;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_00117933:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1a0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,(ulong)(local_1e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
      &local_210.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_),
                    local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar14) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1e8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_1a0);
  local_180.sa_handler = (__sighandler_t)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  lVar15 = (long)(local_1e8._M_string_length - (long)local_1e8._M_dataplus._M_p) >> 5;
  uVar17 = -(ulong)(lVar15 + 1U >> 0x3d != 0) | lVar15 * 8 + 8U;
  __s = (pointer)operator_new__(uVar17);
  memset(__s,0,uVar17);
  if ((pointer)local_1e8._M_string_length != local_1e8._M_dataplus._M_p) {
    lVar13 = 0;
    do {
      *(undefined8 *)(__s + lVar13 * 8) = *(undefined8 *)local_1e8._M_dataplus._M_p;
      lVar13 = lVar13 + 1;
      local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p + 0x20;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar13);
  }
  pcVar1 = __s + lVar15 * 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_1c0._M_string_length._0_4_ = local_1f0;
  local_1c0._M_dataplus._M_p = __s;
  memset(&local_c8,0,0x98);
  sigemptyset((sigset_t *)local_c0);
  local_c8 = (_union_1457)0x1;
  while (iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_180), iVar4 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_250._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_250._M_dataplus._M_p == psVar9) {
        local_250.field_2._M_allocated_capacity = *psVar9;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *psVar9;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
        local_290.field_2._M_allocated_capacity = *psVar9;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *psVar9;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1c8[1] = 0x513;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      std::operator+(&local_270,&local_290,&local_210);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2b0._M_dataplus._M_p == psVar9) {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
        local_2b0.field_2._8_8_ = plVar6[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
        local_2d0.field_2._M_allocated_capacity = *psVar9;
        local_2d0.field_2._8_8_ = plVar6[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
        local_2f0.field_2._8_8_ = plVar6[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2f0);
    }
  }
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_001183cd;
  }
  else {
    iVar4 = fork();
    if (iVar4 != 0) goto LAB_00117de3;
    ExecDeathTestChildMain(&local_1c0);
LAB_001183cd:
    AssumeRole();
  }
  iVar4 = getpagesize();
  __len = (size_t)(iVar4 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
      local_290.field_2._M_allocated_capacity = *psVar9;
      local_290.field_2._8_8_ = plVar6[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar9;
    }
    local_290._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
      local_270.field_2._M_allocated_capacity = *psVar9;
      local_270.field_2._8_8_ = plVar6[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar9;
    }
    local_270._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_210._M_dataplus._M_p._0_4_ = 0x51f;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
      local_2d0.field_2._8_8_ = plVar6[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
      local_2f0.field_2._8_8_ = plVar6[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2f0);
  }
  lVar15 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar15 = __len - 0x40;
  }
  if (((uint)(iVar4 * 2) < 0x41) || (((ulong)(lVar15 + (long)__addr) & 0x3f) != 0)) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
      local_290.field_2._M_allocated_capacity = *psVar9;
      local_290.field_2._8_8_ = plVar6[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar9;
    }
    local_290._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
      local_270.field_2._M_allocated_capacity = *psVar9;
      local_270.field_2._8_8_ = plVar6[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar9;
    }
    local_270._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_210._M_dataplus._M_p._0_4_ = 0x52d;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
      local_2d0.field_2._8_8_ = plVar6[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
      local_2f0.field_2._8_8_ = plVar6[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2f0);
  }
  iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_1c0);
  iVar5 = munmap(__addr,__len);
  if (iVar5 == -1) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
      local_290.field_2._M_allocated_capacity = *psVar9;
      local_290.field_2._8_8_ = plVar6[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar9;
    }
    local_290._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
      local_270.field_2._M_allocated_capacity = *psVar9;
      local_270.field_2._8_8_ = plVar6[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar9;
    }
    local_270._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_210._M_dataplus._M_p._0_4_ = 0x531;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
      local_2d0.field_2._8_8_ = plVar6[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
      local_2f0.field_2._8_8_ = plVar6[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2f0);
  }
LAB_00117de3:
  while (iVar5 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0), iVar5 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_250._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_250._M_dataplus._M_p == psVar9) {
        local_250.field_2._M_allocated_capacity = *psVar9;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *psVar9;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
        local_290.field_2._M_allocated_capacity = *psVar9;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *psVar9;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1c8[1] = 0x53d;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      std::operator+(&local_270,&local_290,&local_210);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2b0._M_dataplus._M_p == psVar9) {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
        local_2b0.field_2._8_8_ = plVar6[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
        local_2d0.field_2._M_allocated_capacity = *psVar9;
        local_2d0.field_2._8_8_ = plVar6[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2d0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
        local_2f0.field_2._8_8_ = plVar6[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar9;
      }
      local_2f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2f0);
    }
  }
  if (iVar4 != -1) {
    do {
      iVar5 = close(local_1ec);
      if (iVar5 != -1) {
        *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f0;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        operator_delete__(__s);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        return OVERSEE_TEST;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
      local_270.field_2._M_allocated_capacity = *psVar9;
      local_270.field_2._8_8_ = plVar6[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar9;
    }
    local_270._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar9) {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
      local_2b0.field_2._8_8_ = plVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_230._M_dataplus._M_p._0_4_ = 0x56f;
    StreamableToString<int>(&local_250,(int *)&local_230);
    std::operator+(&local_2d0,&local_2b0,&local_250);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_2f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
      local_2f0.field_2._8_8_ = plVar6[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_c8.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_b8 = *(ulong *)p_Var10;
      uStack_b0 = plVar6[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var10;
    }
    local_c0 = (undefined1  [8])plVar6[1];
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_180.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar14) {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_170[0]._8_8_ = plVar6[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_180);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_290._M_dataplus._M_p == psVar9) {
    local_290.field_2._M_allocated_capacity = *psVar9;
    local_290.field_2._8_8_ = plVar6[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar9;
  }
  local_290._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
    local_270.field_2._M_allocated_capacity = *psVar9;
    local_270.field_2._8_8_ = plVar6[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar9;
  }
  local_270._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_210._M_dataplus._M_p._0_4_ = 0x540;
  StreamableToString<int>(&local_230,(int *)&local_210);
  std::operator+(&local_2b0,&local_270,&local_230);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_2d0._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_2d0._M_dataplus._M_p == psVar9) {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
    local_2d0.field_2._8_8_ = plVar6[3];
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar9;
  }
  local_2d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f0._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_2f0._M_dataplus._M_p == psVar9) {
    local_2f0.field_2._M_allocated_capacity = *psVar9;
    local_2f0.field_2._8_8_ = plVar6[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *psVar9;
  }
  local_2f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort(&local_2f0);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}